

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

uint share_find_unused_id(ssh_sharing_state *sharestate,uint first)

{
  int iVar1;
  int index;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  uint local_8150 [2];
  ssh_sharing_connstate dummy_1;
  ssh_sharing_connstate dummy;
  uint ret;
  ssh_sharing_connstate *cs;
  int high_orig;
  int high;
  int mid;
  int low;
  int low_orig;
  uint first_local;
  ssh_sharing_state *sharestate_local;
  
  dummy_1.plug.vt._0_4_ = first;
  low = first;
  _low_orig = sharestate;
  pvVar3 = findrelpos234(sharestate->connections,&dummy_1.plug,(cmpfn234)0x0,4,&mid);
  if (pvVar3 == (void *)0x0) {
    sharestate_local._4_4_ = low;
  }
  else {
    high = mid;
    iVar1 = count234(_low_orig->connections);
    while (cs._4_4_ = iVar1, 1 < cs._4_4_ - high) {
      index = (cs._4_4_ + high) / 2;
      piVar4 = (int *)index234(_low_orig->connections,index);
      iVar1 = index;
      if (*piVar4 == low + (index - mid)) {
        iVar1 = cs._4_4_;
        high = index;
      }
    }
    uVar2 = low + (high - mid) + 1;
    local_8150[0] = uVar2;
    pvVar3 = find234(_low_orig->connections,local_8150,(cmpfn234)0x0);
    sharestate_local._4_4_ = uVar2;
    if (pvVar3 != (void *)0x0) {
      __assert_fail("NULL == find234(sharestate->connections, &dummy, NULL)",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c"
                    ,0x173,
                    "unsigned int share_find_unused_id(struct ssh_sharing_state *, unsigned int)");
    }
  }
  return sharestate_local._4_4_;
}

Assistant:

static unsigned share_find_unused_id
(struct ssh_sharing_state *sharestate, unsigned first)
{
    int low_orig, low, mid, high, high_orig;
    struct ssh_sharing_connstate *cs;
    unsigned ret;

    /*
     * Find the lowest unused downstream ID greater or equal to
     * 'first'.
     *
     * Begin by seeing if 'first' itself is available. If it is, we'll
     * just return it; if it's already in the tree, we'll find the
     * tree index where it appears and use that for the next stage.
     */
    {
        struct ssh_sharing_connstate dummy;
        dummy.id = first;
        cs = findrelpos234(sharestate->connections, &dummy, NULL,
                           REL234_GE, &low_orig);
        if (!cs)
            return first;
    }

    /*
     * Now binary-search using the counted B-tree, to find the largest
     * ID which is in a contiguous sequence from the beginning of that
     * range.
     */
    low = low_orig;
    high = high_orig = count234(sharestate->connections);
    while (high - low > 1) {
        mid = (high + low) / 2;
        cs = index234(sharestate->connections, mid);
        if (cs->id == first + (mid - low_orig))
            low = mid;                 /* this one is still in the sequence */
        else
            high = mid;                /* this one is past the end */
    }

    /*
     * Now low is the tree index of the largest ID in the initial
     * sequence. So the return value is one more than low's id, and we
     * know low's id is given by the formula in the binary search loop
     * above.
     *
     * (If an SSH connection went on for _enormously_ long, we might
     * reach a point where all ids from 'first' to UINT_MAX were in
     * use. In that situation the formula below would wrap round by
     * one and return zero, which is conveniently the right way to
     * signal 'no id available' from this function.)
     */
    ret = first + (low - low_orig) + 1;
    {
        struct ssh_sharing_connstate dummy;
        dummy.id = ret;
        assert(NULL == find234(sharestate->connections, &dummy, NULL));
    }
    return ret;
}